

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Database_tmpl_impl.hpp
# Opt level: O1

bean_ptr<X> * __thiscall
hiberlite::Database::copyBean<X>(bean_ptr<X> *__return_storage_ptr__,Database *this,X *c)

{
  X *ptr;
  
  ptr = (X *)operator_new(0x78);
  std::
  _Rb_tree<std::pair<int,_double>,_std::pair<int,_double>,_std::_Identity<std::pair<int,_double>_>,_std::less<std::pair<int,_double>_>,_std::allocator<std::pair<int,_double>_>_>
  ::_Rb_tree((_Rb_tree<std::pair<int,_double>,_std::pair<int,_double>,_std::_Identity<std::pair<int,_double>_>,_std::less<std::pair<int,_double>_>,_std::allocator<std::pair<int,_double>_>_>
              *)ptr,(_Rb_tree<std::pair<int,_double>,_std::pair<int,_double>,_std::_Identity<std::pair<int,_double>_>,_std::less<std::pair<int,_double>_>,_std::allocator<std::pair<int,_double>_>_>
                     *)c);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&ptr->vvi,&c->vvi);
  std::_Rb_tree<$98d3f54$>::_Rb_tree(&(ptr->mm)._M_t,&(c->mm)._M_t);
  manageBean<X>(__return_storage_ptr__,this,ptr);
  return __return_storage_ptr__;
}

Assistant:

bean_ptr<C> Database::copyBean(const C& c)
{
	return manageBean<C>( new C(c) );
}